

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Areal_Object_State_PDU.cpp
# Opt level: O1

KString * __thiscall
KDIS::PDU::Areal_Object_State_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Areal_Object_State_PDU *this)

{
  pointer pWVar1;
  KString *pKVar2;
  ostream *poVar3;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  pointer pWVar4;
  KStringStream ss;
  KString local_2c0;
  KString *local_2a0;
  KString local_298;
  KString local_278;
  KString local_258;
  KString local_238;
  KString local_218;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_2a0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_2c0,(Header7 *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-Areal Object State PDU-\n",0x19);
  Object_State_Header::GetAsString_abi_cxx11_(&local_218,&this->super_Object_State_Header);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_218._M_dataplus._M_p,local_218._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Modification:\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tLocation: ",0xb);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Object Type: ",0xd);
  DATA_TYPE::ObjectType::GetAsString_abi_cxx11_(&local_238,&this->m_ObjTyp);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_238._M_dataplus._M_p,local_238._M_string_length);
  DATA_TYPE::ArealObjectAppearance::GetAsString_abi_cxx11_(&local_258,&this->m_Apperance);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_258._M_dataplus._M_p,local_258._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Number Of Points: ",0x12);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Requestor ID:\n",0xe);
  DATA_TYPE::SimulationIdentifier::GetAsString_abi_cxx11_(&local_1d8,&this->m_ReqID);
  UTILS::IndentString(&local_278,&local_1d8,Tabs,in_CL);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_278._M_dataplus._M_p,local_278._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Receiving ID:\n",0xe);
  DATA_TYPE::SimulationIdentifier::GetAsString_abi_cxx11_(&local_1f8,&this->m_RecvID);
  UTILS::IndentString(&local_298,&local_1f8,Tabs_00,in_CL);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,local_298._M_dataplus._M_p,local_298._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  pWVar4 = (this->m_vPoints).
           super__Vector_base<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pWVar1 = (this->m_vPoints).
           super__Vector_base<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pWVar4 != pWVar1) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Point Location: ",0x10);
      (*(pWVar4->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_2c0,pWVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
      pWVar4 = pWVar4 + 1;
    } while (pWVar4 != pWVar1);
  }
  pKVar2 = local_2a0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return pKVar2;
}

Assistant:

KString Areal_Object_State_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Areal Object State PDU-\n"
       << Object_State_Header::GetAsString()
       << "Modification:\n"
       << "\tLocation: " << ( KUINT16 )m_ModificationUnion.m_ui8LocBit << "\n"
       << "Object Type: " << m_ObjTyp.GetAsString()
       << m_Apperance.GetAsString()
       << "Number Of Points: " << m_ui16NumPoints << "\n"
       << "Requestor ID:\n" << IndentString( m_ReqID.GetAsString(), 1 )
       << "Receiving ID:\n" << IndentString( m_RecvID.GetAsString(), 1 );

    vector<WorldCoordinates>::const_iterator citr = m_vPoints.begin();
    vector<WorldCoordinates>::const_iterator citrEnd = m_vPoints.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << "Point Location: " << citr->GetAsString();
    }

    return ss.str();
}